

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O3

uint32_t longest_match_slow_avx2(deflate_state *s,Pos cur_match)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  Pos *pPVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [32];
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uchar *local_a8;
  uchar *local_a0;
  uint local_94;
  ulong local_68;
  ulong local_38;
  
  uVar15 = (ulong)cur_match;
  uVar1 = s->strstart;
  uVar16 = (ulong)uVar1;
  uVar2 = s->w_mask;
  puVar3 = s->window;
  uVar10 = 2;
  if (s->prev_length != 0) {
    uVar10 = s->prev_length;
  }
  uVar18 = 0xffffffff;
  if (3 < uVar10) {
    uVar18 = (uint)(uVar10 < 8) << 2 | 0xfffffff9;
  }
  local_68 = *(ulong *)(puVar3 + (uVar18 + uVar10) + uVar16);
  local_a8 = puVar3 + (uVar18 + uVar10);
  uVar18 = s->lookahead;
  uVar25 = s->max_chain_length >> 2;
  if (uVar10 < s->good_match) {
    uVar25 = s->max_chain_length;
  }
  uVar8 = s->w_size - 0x106;
  uVar17 = 0;
  uVar13 = uVar1 - uVar8;
  if (uVar1 < uVar8 || uVar13 == 0) {
    uVar13 = 0;
  }
  pPVar4 = s->prev;
  lVar5 = *(long *)(puVar3 + uVar16);
  uVar8 = s->nice_match;
  uVar19 = uVar13;
  local_a0 = puVar3;
  if (2 < uVar10) {
    uVar17 = 0;
    uVar9 = (*s->update_hash)(0,(uint)((ulong)lVar5 >> 8) & 0xff);
    uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar3[uVar16 + 2]);
    uVar21 = 3;
    do {
      uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar3[uVar21 + uVar16]);
      if (s->head[uVar9] < (ushort)uVar15) {
        uVar17 = (ulong)((int)uVar21 - 2);
        uVar15 = (ulong)s->head[uVar9];
      }
      uVar19 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar19;
    } while (uVar19 <= uVar10);
    uVar19 = (int)uVar17 + uVar13;
    uVar14 = uVar10;
    if ((ushort)uVar15 <= (ushort)uVar19) {
LAB_00113ff6:
      if (s->lookahead <= uVar14) {
        return s->lookahead;
      }
      return uVar14;
    }
    local_a8 = local_a8 + -(uVar17 & 0xffff);
    local_a0 = puVar3 + -(uVar17 & 0xffff);
  }
  if ((uint)uVar15 < uVar1) {
    local_94 = (uint)(local_68 >> 0x10) & 0xffff;
    local_38 = local_68 >> 0x20;
    do {
      uVar11 = (ushort)uVar19;
      if (uVar10 < 4) {
        while( true ) {
          uVar23 = (uint)uVar15;
          uVar21 = uVar15 & 0xffff;
          if ((*(ushort *)(local_a8 + uVar21) == (ushort)local_68) &&
             (*(short *)(local_a0 + uVar21) == (short)lVar5)) break;
          if (uVar25 == 1) {
            return uVar10;
          }
          uVar15 = (ulong)pPVar4[(uint)uVar21 & uVar2];
          uVar25 = uVar25 - 1;
          if (pPVar4[(uint)uVar21 & uVar2] <= uVar11) {
            return uVar10;
          }
        }
      }
      else if (uVar10 < 8) {
        while( true ) {
          uVar23 = (uint)uVar15;
          uVar21 = uVar15 & 0xffff;
          if ((*(uint *)(local_a8 + uVar21) == (local_94 << 0x10 | (uint)(ushort)local_68)) &&
             (*(int *)(local_a0 + uVar21) == (int)lVar5)) break;
          if (uVar25 == 1) {
            return uVar10;
          }
          uVar15 = (ulong)pPVar4[(uint)uVar21 & uVar2];
          uVar25 = uVar25 - 1;
          if (pPVar4[(uint)uVar21 & uVar2] <= uVar11) {
            return uVar10;
          }
        }
      }
      else {
        while( true ) {
          uVar23 = (uint)uVar15;
          uVar21 = uVar15 & 0xffff;
          if ((*(ulong *)(local_a8 + uVar21) ==
               (local_38 << 0x20 | local_68 & 0xffff | (ulong)(local_94 << 0x10))) &&
             (*(long *)(local_a0 + uVar21) == lVar5)) break;
          if (uVar25 == 1) {
            return uVar10;
          }
          uVar15 = (ulong)pPVar4[(uint)uVar21 & uVar2];
          uVar25 = uVar25 - 1;
          if (pPVar4[(uint)uVar21 & uVar2] <= uVar11) {
            return uVar10;
          }
        }
      }
      lVar22 = 0;
      do {
        auVar7 = vpcmpeqb_avx2(*(undefined1 (*) [32])(puVar3 + lVar22 + uVar16 + 2),
                               *(undefined1 (*) [32])(local_a0 + lVar22 + uVar21 + 2));
        uVar14 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
                 (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 |
                 (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3 |
                 (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
                 (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 |
                 (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6 |
                 (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
                 (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 |
                 (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9 |
                 (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
                 (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
                 (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf
                 | (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
                 (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
                 (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
                 (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
                 (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
                 (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
                 (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 |
                 (uint)SUB321(auVar7 >> 0xbf,0) << 0x17 |
                 (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
                 (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
                 (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
                 (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
                 (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
                 (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
                 (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
                 (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f;
        uVar20 = (uint)lVar22;
        if (uVar14 != 0xffffffff) {
          uVar14 = ~uVar14;
          iVar6 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
            }
          }
          uVar20 = uVar20 + iVar6;
          goto LAB_00113dff;
        }
        auVar7 = vpcmpeqb_avx2(*(undefined1 (*) [32])(puVar3 + lVar22 + uVar16 + 0x22),
                               *(undefined1 (*) [32])(local_a0 + lVar22 + uVar21 + 0x22));
        uVar14 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
                 (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 |
                 (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3 |
                 (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
                 (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 |
                 (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6 |
                 (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
                 (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 |
                 (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9 |
                 (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
                 (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
                 (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf
                 | (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
                 (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
                 (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
                 (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
                 (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
                 (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
                 (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 |
                 (uint)SUB321(auVar7 >> 0xbf,0) << 0x17 |
                 (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
                 (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
                 (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
                 (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
                 (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
                 (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
                 (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
                 (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f;
        if (uVar14 != 0xffffffff) {
          uVar14 = ~uVar14;
          iVar6 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
            }
          }
          uVar20 = uVar20 + iVar6 + 0x20;
          goto LAB_00113dff;
        }
        lVar22 = lVar22 + 0x40;
      } while (uVar20 < 0xc0);
      uVar20 = 0x100;
LAB_00113dff:
      lVar22 = (ulong)uVar20 + 2;
      uVar14 = (uint)lVar22;
      if (uVar10 < uVar14) {
        uVar24 = (uVar23 & 0xffff) - ((uint)uVar17 & 0xffff);
        uVar15 = (ulong)uVar24;
        s->match_start = uVar24;
        if (uVar18 < uVar14) {
          return uVar18;
        }
        if (uVar8 <= uVar14) {
          return uVar14;
        }
        uVar10 = uVar20 - 5;
        if (uVar20 < 6) {
          uVar10 = uVar20 - 1;
        }
        if (uVar20 < 2) {
          uVar10 = uVar20 + 1;
        }
        uVar21 = (ulong)uVar10;
        local_68 = *(ulong *)(puVar3 + uVar21 + uVar16);
        local_94 = (uint)(local_68 >> 0x10) & 0xffff;
        local_38 = local_68 >> 0x20;
        uVar10 = uVar14;
        if ((uVar20 < 2) || (uVar1 <= uVar14 + uVar24)) {
          local_a8 = local_a0 + uVar21;
          goto LAB_00113ea3;
        }
        uVar12 = 0;
        uVar17 = 0;
        do {
          iVar6 = (int)uVar12;
          uVar11 = pPVar4[(uVar24 & 0xffff) + iVar6 & uVar2];
          if (uVar11 < (ushort)uVar15) {
            if ((uint)uVar11 <= (uVar13 & 0xffff) + iVar6) goto LAB_00113ff6;
            uVar15 = (ulong)uVar11;
            uVar17 = uVar12;
          }
          uVar12 = (ulong)(iVar6 + 1U);
        } while (iVar6 + 1U <= uVar20 - 1);
        uVar9 = (*s->update_hash)(0,(uint32_t)puVar3[lVar22 + (uVar16 - 4)]);
        uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar3[lVar22 + (uVar16 - 3)]);
        uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar3[lVar22 + (uVar16 - 2)]);
        uVar11 = s->head[uVar9];
        if (uVar11 < (ushort)uVar15) {
          uVar17 = (ulong)(uVar20 - 2);
          uVar15 = (ulong)uVar11;
          if ((uint)uVar11 <= (uVar20 - 2 & 0xffff) + (uVar13 & 0xffff)) goto LAB_00113ff6;
        }
        uVar19 = (int)uVar17 + uVar13;
        local_a0 = puVar3 + -(uVar17 & 0xffff);
        local_a8 = local_a0 + uVar21;
      }
      else {
LAB_00113ea3:
        uVar25 = uVar25 - 1;
        if (uVar25 == 0) {
          return uVar10;
        }
        uVar15 = (ulong)pPVar4[uVar23 & 0xffff & uVar2];
        if (pPVar4[uVar23 & 0xffff & uVar2] <= uVar11) {
          return uVar10;
        }
      }
    } while (((uint)uVar15 & 0xffff) < uVar1);
  }
  return uVar10;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}